

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_userid_filter_module.c
# Opt level: O0

char * ngx_http_userid_path(ngx_conf_t *cf,void *post,void *data)

{
  undefined4 *puVar1;
  u_char *new;
  u_char *p;
  ngx_str_t *path;
  void *data_local;
  void *post_local;
  ngx_conf_t *cf_local;
  
  puVar1 = (undefined4 *)ngx_pnalloc(cf->pool,*data + 7);
  if (puVar1 == (undefined4 *)0x0) {
    cf_local = (ngx_conf_t *)0xffffffffffffffff;
  }
  else {
    *puVar1 = 0x6170203b;
    *(undefined2 *)(puVar1 + 1) = 0x6874;
    *(undefined1 *)((long)puVar1 + 6) = 0x3d;
    memcpy((void *)((long)puVar1 + 7),*(void **)((long)data + 8),*data);
    *(long *)data = *data + 7;
    *(undefined4 **)((long)data + 8) = puVar1;
    cf_local = (ngx_conf_t *)0x0;
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_userid_path(ngx_conf_t *cf, void *post, void *data)
{
    ngx_str_t  *path = data;

    u_char  *p, *new;

    new = ngx_pnalloc(cf->pool, sizeof("; path=") - 1 + path->len);
    if (new == NULL) {
        return NGX_CONF_ERROR;
    }

    p = ngx_cpymem(new, "; path=", sizeof("; path=") - 1);
    ngx_memcpy(p, path->data, path->len);

    path->len += sizeof("; path=") - 1;
    path->data = new;

    return NGX_CONF_OK;
}